

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.h
# Opt level: O2

VisionFeaturePrint_Objects * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_objects(VisionFeaturePrint *this)

{
  VisionFeaturePrint_Objects *this_00;
  
  if (this->_oneof_case_[0] == 0x15) {
    this_00 = (VisionFeaturePrint_Objects *)(this->VisionFeaturePrintType_).scene_;
  }
  else {
    clear_VisionFeaturePrintType(this);
    this->_oneof_case_[0] = 0x15;
    this_00 = (VisionFeaturePrint_Objects *)operator_new(0x30);
    VisionFeaturePrint_Objects::VisionFeaturePrint_Objects(this_00);
    (this->VisionFeaturePrintType_).objects_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects* VisionFeaturePrint::mutable_objects() {
  if (!has_objects()) {
    clear_VisionFeaturePrintType();
    set_has_objects();
    VisionFeaturePrintType_.objects_ = new ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CoreMLModels.VisionFeaturePrint.objects)
  return VisionFeaturePrintType_.objects_;
}